

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration_manager.cpp
# Opt level: O2

pair<std::shared_ptr<miniros::master::NodeRef>,_std::shared_ptr<miniros::master::NodeRef>_> *
__thiscall
miniros::master::RegistrationManager::registerNodeApi
          (pair<std::shared_ptr<miniros::master::NodeRef>,_std::shared_ptr<miniros::master::NodeRef>_>
           *__return_storage_ptr__,RegistrationManager *this,string *caller_id,string *caller_api)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
  *this_00;
  __type_conflict _Var1;
  size_type sVar2;
  __shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  NodeRef *this_01;
  pthread_mutex_t *__mutex;
  allocator<char> local_c1;
  pthread_mutex_t *local_c0;
  shared_ptr<miniros::master::NodeRef> node_ref;
  NodeRefPtr prevNode;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __mutex = (pthread_mutex_t *)&this->m_guard;
  ::std::mutex::lock((mutex *)&__mutex->__data);
  node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &this->m_nodes;
  sVar2 = ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
          ::count(this_00,caller_id);
  if (sVar2 != 0) {
    p_Var3 = &::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
              ::operator[](this_00,caller_id)->
              super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>;
    ::std::__shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>,
               p_Var3);
  }
  prevNode.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  prevNode.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    local_c0 = __mutex;
    NodeRef::getApi_abi_cxx11_
              (&local_90,
               node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    _Var1 = ::std::operator==(&local_90,caller_api);
    ::std::__cxx11::string::~string((string *)&local_90);
    __mutex = local_c0;
    if (_Var1) goto LAB_0027a07a;
    ::std::__shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&prevNode.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>,
               &node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>);
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (registerNodeApi::loc.initialized_ == false) {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"miniros.unknown_package",&local_c1);
      ::std::operator+(&local_50,&local_70,".");
      ::std::operator+(&local_90,&local_50,"reg");
      console::initializeLogLocation(&registerNodeApi::loc,&local_90,Warn);
      ::std::__cxx11::string::~string((string *)&local_90);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_70);
    }
    if (registerNodeApi::loc.level_ != Warn) {
      console::setLogLocationLevel(&registerNodeApi::loc,Warn);
      console::checkLogLocationEnabled(&registerNodeApi::loc);
    }
    if (registerNodeApi::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,registerNodeApi::loc.logger_,registerNodeApi::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/registration_manager.cpp"
                     ,0xa5,
                     "std::pair<NodeRefPtr, NodeRefPtr> miniros::master::RegistrationManager::registerNodeApi(const std::string &, const std::string &)"
                     ,"New node registered with name=\"%s\" api=%s",(caller_id->_M_dataplus)._M_p,
                     (caller_api->_M_dataplus)._M_p);
    }
    ::std::
    _Rb_tree<std::shared_ptr<miniros::master::NodeRef>,std::shared_ptr<miniros::master::NodeRef>,std::_Identity<std::shared_ptr<miniros::master::NodeRef>>,std::less<std::shared_ptr<miniros::master::NodeRef>>,std::allocator<std::shared_ptr<miniros::master::NodeRef>>>
    ::_M_insert_unique<std::shared_ptr<miniros::master::NodeRef>const&>
              ((_Rb_tree<std::shared_ptr<miniros::master::NodeRef>,std::shared_ptr<miniros::master::NodeRef>,std::_Identity<std::shared_ptr<miniros::master::NodeRef>>,std::less<std::shared_ptr<miniros::master::NodeRef>>,std::allocator<std::shared_ptr<miniros::master::NodeRef>>>
                *)&this->m_nodesToShutdown,&node_ref);
  }
  this_01 = (NodeRef *)operator_new(0x1b8);
  NodeRef::NodeRef(this_01,caller_id,caller_api);
  ::std::__shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>::
  reset<miniros::master::NodeRef>
            (&node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>,
             this_01);
  p_Var3 = &::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
            ::operator[](this_00,caller_id)->
            super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>;
  ::std::__shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var3,&node_ref.
                     super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>);
LAB_0027a07a:
  ::std::pair<std::shared_ptr<miniros::master::NodeRef>,_std::shared_ptr<miniros::master::NodeRef>_>
  ::
  pair<std::shared_ptr<miniros::master::NodeRef>_&,_std::shared_ptr<miniros::master::NodeRef>_&,_true>
            (__return_storage_ptr__,&node_ref,&prevNode);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&prevNode.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&node_ref.super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pthread_mutex_unlock(__mutex);
  return __return_storage_ptr__;
}

Assistant:

std::pair<NodeRefPtr, NodeRefPtr> RegistrationManager::registerNodeApi(const std::string& caller_id, const std::string& caller_api)
{
  std::scoped_lock<std::mutex> lock(m_guard);

  std::shared_ptr<NodeRef> node_ref;
  if (m_nodes.count(caller_id))
    node_ref = m_nodes[caller_id];

  NodeRefPtr prevNode;
  if (node_ref) {
    if (node_ref->getApi() == caller_api) {
      return {node_ref, prevNode};
    } else {
      prevNode = node_ref;
      MINIROS_WARN_NAMED("reg", "New node registered with name=\"%s\" api=%s", caller_id.c_str(), caller_api.c_str());
      m_nodesToShutdown.insert(node_ref);
    }
  }

  node_ref.reset(new NodeRef(caller_id, caller_api));
  m_nodes[caller_id] = node_ref;

  return {node_ref, prevNode};
}